

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

string * duckdb::GetDefaultUserAgent_abi_cxx11_(void)

{
  string *fmt_str;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"duckdb/%s(%s)",&local_51);
  fmt_str = (string *)DuckDB::LibraryVersion();
  DuckDB::Platform_abi_cxx11_();
  StringUtil::Format<char_const*,std::__cxx11::string>
            (in_RDI,(StringUtil *)local_30,fmt_str,(char *)local_50,in_R8);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

const string GetDefaultUserAgent() {
	return StringUtil::Format("duckdb/%s(%s)", DuckDB::LibraryVersion(), DuckDB::Platform());
}